

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnReader::DecompressInternal
          (ColumnReader *this,type codec,const_data_ptr_t src,idx_t src_size,data_ptr_t dst,
          idx_t dst_size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  BrotliDecoderResult BVar5;
  size_t code;
  BrotliDecoderStateInternal *s;
  InternalException *this_00;
  runtime_error *prVar6;
  long *plVar7;
  long *plVar8;
  unsigned_long src_size_size_t;
  unsigned_long dst_size_size_t;
  size_t uncompressed_size;
  type local_22c;
  data_ptr_t local_228;
  const_data_ptr_t local_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [16];
  mz_ulong local_1a8;
  uchar *puStack_1a0;
  undefined8 local_198;
  mz_ulong mStack_190;
  char *local_188;
  mz_internal_state *pmStack_180;
  mz_alloc_func local_178;
  mz_free_func p_Stack_170;
  void *local_168;
  undefined8 uStack_160;
  mz_ulong local_158;
  mz_ulong mStack_150;
  MiniZStreamType local_148;
  
  local_22c = codec;
  local_228 = dst;
  local_220 = src;
  switch(codec) {
  case UNCOMPRESSED:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_1b8._0_8_ = &local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Parquet data unexpectedly uncompressed","");
    duckdb::InternalException::InternalException(this_00,(string *)local_1b8);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  case SNAPPY:
    local_1b8._0_8_ = (uchar *)0x0;
    bVar1 = duckdb_snappy::GetUncompressedLength((char *)src,src_size,(size_t *)local_1b8);
    if (bVar1) {
      if (local_1b8._0_8_ == dst_size) {
        bVar1 = duckdb_snappy::RawUncompress((char *)src,src_size,(char *)dst);
        if (bVar1) {
          return;
        }
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Snappy decompression failure");
      }
      else {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar6,"Snappy decompression failure: Uncompressed data size mismatch");
      }
    }
    else {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Snappy decompression failure");
    }
    break;
  case GZIP:
    local_158 = 0;
    mStack_150 = 0;
    local_168 = (void *)0x0;
    uStack_160._0_4_ = 0;
    uStack_160._4_4_ = 0;
    local_178 = (mz_alloc_func)0x0;
    p_Stack_170 = (mz_free_func)0x0;
    local_188 = (char *)0x0;
    pmStack_180 = (mz_internal_state *)0x0;
    local_198._0_4_ = 0;
    local_198._4_4_ = 0;
    mStack_190 = 0;
    local_1a8 = 0;
    puStack_1a0 = (uchar *)0x0;
    local_1b8._0_8_ = (uchar *)0x0;
    local_1b8._8_8_ = 0;
    local_148 = MINIZ_TYPE_NONE;
    MiniZStream::Decompress((MiniZStream *)local_1b8,(char *)src,src_size,(char *)dst,dst_size);
    MiniZStream::~MiniZStream((MiniZStream *)local_1b8);
    return;
  default:
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    duckdb_parquet::operator<<((ostream *)&local_1a8,&local_22c);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_1d8,"Unsupported compression codec \"",&local_1f8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    local_218 = (long *)*plVar7;
    plVar8 = plVar7 + 2;
    if (local_218 == plVar8) {
      local_208 = *plVar8;
      lStack_200 = plVar7[3];
      local_218 = &local_208;
    }
    else {
      local_208 = *plVar8;
    }
    local_210 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)&local_218);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case BROTLI:
    s = duckdb_brotli::BrotliDecoderCreateInstance
                  ((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    local_1b8._0_8_ = (uchar *)0x0;
    local_218 = (long *)src_size;
    local_1d8._M_dataplus._M_p = (pointer)dst_size;
    BVar5 = duckdb_brotli::BrotliDecoderDecompressStream
                      (s,(size_t *)&local_218,&local_220,(size_t *)&local_1d8,&local_228,
                       (size_t *)local_1b8);
    if (BVar5 == BROTLI_DECODER_RESULT_SUCCESS) {
      duckdb_brotli::BrotliDecoderDestroyInstance(s);
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Brotli Decompression failure");
    break;
  case ZSTD:
    code = duckdb_zstd::ZSTD_decompress(dst,dst_size,src,src_size);
    uVar4 = duckdb_zstd::ZSTD_isError(code);
    if ((code == dst_size) && (uVar4 == 0)) {
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"ZSTD Decompression failure");
    break;
  case LZ4_RAW:
    iVar2 = duckdb_lz4::LZ4_decompress_safe((char *)src,(char *)dst,(int)src_size,(int)dst_size);
    iVar3 = NumericCastImpl<int,_unsigned_long,_false>::Convert(dst_size);
    if (iVar2 == iVar3) {
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"LZ4 decompression failure");
  }
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ColumnReader::DecompressInternal(CompressionCodec::type codec, const_data_ptr_t src, idx_t src_size,
                                      data_ptr_t dst, idx_t dst_size) {
	switch (codec) {
	case CompressionCodec::UNCOMPRESSED:
		throw InternalException("Parquet data unexpectedly uncompressed");
	case CompressionCodec::GZIP: {
		MiniZStream s;
		s.Decompress(const_char_ptr_cast(src), src_size, char_ptr_cast(dst), dst_size);
		break;
	}
	case CompressionCodec::LZ4_RAW: {
		auto res =
		    duckdb_lz4::LZ4_decompress_safe(const_char_ptr_cast(src), char_ptr_cast(dst),
		                                    UnsafeNumericCast<int32_t>(src_size), UnsafeNumericCast<int32_t>(dst_size));
		if (res != NumericCast<int>(dst_size)) {
			throw std::runtime_error("LZ4 decompression failure");
		}
		break;
	}
	case CompressionCodec::SNAPPY: {
		{
			size_t uncompressed_size = 0;
			auto res = duckdb_snappy::GetUncompressedLength(const_char_ptr_cast(src), src_size, &uncompressed_size);
			if (!res) {
				throw std::runtime_error("Snappy decompression failure");
			}
			if (uncompressed_size != dst_size) {
				throw std::runtime_error("Snappy decompression failure: Uncompressed data size mismatch");
			}
		}
		auto res = duckdb_snappy::RawUncompress(const_char_ptr_cast(src), src_size, char_ptr_cast(dst));
		if (!res) {
			throw std::runtime_error("Snappy decompression failure");
		}
		break;
	}
	case CompressionCodec::ZSTD: {
		auto res = duckdb_zstd::ZSTD_decompress(dst, dst_size, src, src_size);
		if (duckdb_zstd::ZSTD_isError(res) || res != dst_size) {
			throw std::runtime_error("ZSTD Decompression failure");
		}
		break;
	}
	case CompressionCodec::BROTLI: {
		auto state = duckdb_brotli::BrotliDecoderCreateInstance(nullptr, nullptr, nullptr);
		size_t total_out = 0;
		auto src_size_size_t = NumericCast<size_t>(src_size);
		auto dst_size_size_t = NumericCast<size_t>(dst_size);

		auto res = duckdb_brotli::BrotliDecoderDecompressStream(state, &src_size_size_t, &src, &dst_size_size_t, &dst,
		                                                        &total_out);
		if (res != duckdb_brotli::BROTLI_DECODER_RESULT_SUCCESS) {
			throw std::runtime_error("Brotli Decompression failure");
		}
		duckdb_brotli::BrotliDecoderDestroyInstance(state);
		break;
	}

	default: {
		std::stringstream codec_name;
		codec_name << codec;
		throw std::runtime_error("Unsupported compression codec \"" + codec_name.str() +
		                         "\". Supported options are uncompressed, brotli, gzip, lz4_raw, snappy or zstd");
	}
	}
}